

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waveform_to_spectrum.cc
# Opt level: O0

void __thiscall
sptk::WaveformToSpectrum::WaveformToSpectrum
          (WaveformToSpectrum *this,int frame_length,int fft_length,InputOutputFormats output_format
          ,double epsilon,double relative_floor_in_decibels)

{
  undefined8 *in_RDI;
  FilterCoefficientsToSpectrum *in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  allocator_type *__a;
  value_type *__value;
  size_type in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR__WaveformToSpectrum_00146500;
  FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
            (in_XMM0_Qa,(int)((ulong)in_XMM1_Qa >> 0x20),(int)in_XMM1_Qa,
             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
             (InputOutputFormats)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (double)in_stack_ffffffffffffffc0);
  __a = (allocator_type *)(in_RDI + 0x1b);
  __value = (value_type *)&stack0xffffffffffffffcf;
  std::allocator<double>::allocator((allocator<double> *)0x11826d);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x118292);
  return;
}

Assistant:

WaveformToSpectrum::WaveformToSpectrum(
    int frame_length, int fft_length,
    SpectrumToSpectrum::InputOutputFormats output_format, double epsilon,
    double relative_floor_in_decibels)
    : filter_coefficients_to_spectrum_(frame_length - 1, 0, fft_length,
                                       output_format, epsilon,
                                       relative_floor_in_decibels),
      dummy_for_filter_coefficients_to_spectrum_(1, 1.0) {
}